

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O2

int ply_read_header(p_ply ply)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  e_ply_storage_mode eVar4;
  e_ply_type eVar5;
  long in_RAX;
  undefined1 *puVar6;
  p_ply_element __dest;
  p_ply_property __dest_00;
  size_t sVar7;
  char *pcVar8;
  long local_38;
  
  local_38 = in_RAX;
  iVar2 = BREFILL(ply);
  if (iVar2 == 0) {
    pcVar8 = "Unable to read magic number from file";
  }
  else {
    if (((ply->buffer[0] == 'p') && (ply->buffer[1] == 'l')) && (ply->buffer[2] == 'y')) {
      cVar1 = ply->buffer[3];
      iVar2 = isspace((int)cVar1);
      if (iVar2 != 0) {
        uVar3 = 0;
        if (cVar1 == '\r') {
          uVar3 = (uint)(ply->buffer[4] == '\n');
        }
        ply->rn = uVar3;
        ply->buffer_first = ply->buffer_first + 3;
        iVar2 = ply_read_word(ply);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = strcmp(ply->buffer + ply->buffer_token,"format");
        if ((iVar2 == 0) && (iVar2 = ply_read_word(ply), iVar2 != 0)) {
          eVar4 = ply_find_string(ply->buffer + ply->buffer_token,ply_storage_mode_list);
          ply->storage_mode = eVar4;
          if (eVar4 != ~PLY_BIG_ENDIAN) {
            if (eVar4 == PLY_ASCII) {
              puVar6 = (anonymous_namespace)::ply_idriver_ascii;
            }
            else if (eVar4 == PLY_LITTLE_ENDIAN) {
              puVar6 = (anonymous_namespace)::ply_idriver_binary;
            }
            else {
              puVar6 = (anonymous_namespace)::ply_idriver_binary_reverse;
            }
            ply->idriver = (p_ply_idriver)puVar6;
            iVar2 = ply_read_word(ply);
            if (((iVar2 != 0) && (iVar2 = strcmp(ply->buffer + ply->buffer_token,"1.0"), iVar2 == 0)
                ) && (iVar2 = ply_read_word(ply), iVar2 != 0)) {
LAB_002ff626:
              do {
                do {
                  iVar2 = strcmp(ply->buffer + ply->buffer_token,"end_header");
                  if (iVar2 == 0) {
                    if (ply->rn == 0) {
                      return 1;
                    }
                    sVar7 = ply->buffer_first;
                    if (ply->buffer_last == sVar7) {
                      iVar2 = BREFILL(ply);
                      if (iVar2 == 0) {
                        pcVar8 = "Unexpected end of file";
                        goto LAB_002ff545;
                      }
                      sVar7 = ply->buffer_first;
                    }
                    ply->buffer_first = sVar7 + 1;
                    return 1;
                  }
                  iVar2 = ply_read_header_comment(ply);
                } while (iVar2 != 0);
                iVar2 = strcmp(ply->buffer + ply->buffer_token,"element");
                if (((iVar2 == 0) && (__dest = ply_grow_element(ply), __dest != (p_ply_element)0x0))
                   && (iVar2 = ply_read_word(ply), iVar2 != 0)) {
                  strcpy(__dest->name,ply->buffer + ply->buffer_token);
                  iVar2 = ply_read_word(ply);
                  if (iVar2 != 0) {
                    iVar2 = __isoc99_sscanf(ply->buffer + ply->buffer_token,"%ld",&local_38);
                    if (iVar2 == 1) {
                      __dest->ninstances = local_38;
                      iVar2 = ply_read_word(ply);
                      if (iVar2 != 0) {
LAB_002ff6ec:
                        do {
                          iVar2 = strcmp(ply->buffer + ply->buffer_token,"property");
                          if (((iVar2 == 0) &&
                              (__dest_00 = ply_grow_property(ply,ply->element + ply->nelements + -1)
                              , __dest_00 != (p_ply_property)0x0)) &&
                             (iVar2 = ply_read_word(ply), iVar2 != 0)) {
                            eVar5 = ply_find_string(ply->buffer + ply->buffer_token,ply_type_list);
                            __dest_00->type = eVar5;
                            if (eVar5 != ~PLY_INT8) {
                              if (eVar5 == PLY_LIST) {
                                iVar2 = ply_read_word(ply);
                                if (iVar2 != 0) {
                                  eVar5 = ply_find_string(ply->buffer + ply->buffer_token,
                                                          ply_type_list);
                                  __dest_00->length_type = eVar5;
                                  if ((eVar5 != ~PLY_INT8) &&
                                     (iVar2 = ply_read_word(ply), iVar2 != 0)) {
                                    eVar5 = ply_find_string(ply->buffer + ply->buffer_token,
                                                            ply_type_list);
                                    __dest_00->value_type = eVar5;
                                    if (eVar5 != ~PLY_INT8) goto LAB_002ff7db;
                                  }
                                }
                              }
                              else {
LAB_002ff7db:
                                iVar2 = ply_read_word(ply);
                                if (iVar2 != 0) {
                                  strcpy(__dest_00->name,ply->buffer + ply->buffer_token);
                                  iVar2 = ply_read_word(ply);
                                  if (iVar2 != 0) goto LAB_002ff6ec;
                                }
                              }
                            }
                          }
                          iVar2 = ply_read_header_comment(ply);
                        } while ((iVar2 != 0) || (iVar2 = ply_read_header_obj_info(ply), iVar2 != 0)
                                );
                        goto LAB_002ff626;
                      }
                    }
                    else {
                      ply_ferror(ply,"Expected number got \'%s\'",ply->buffer + ply->buffer_token);
                    }
                  }
                }
                iVar2 = ply_read_header_obj_info(ply);
                if (iVar2 == 0) {
                  ply_ferror(ply,"Unexpected token \'%s\'",ply->buffer + ply->buffer_token);
                  return 0;
                }
              } while( true );
            }
          }
        }
        pcVar8 = "Invalid file format";
LAB_002ff545:
        ply_ferror(ply,pcVar8);
        return 0;
      }
    }
    pcVar8 = "Wrong magic number. Expected \'ply\'";
  }
  (*ply->error_cb)(ply,pcVar8);
  return 0;
}

Assistant:

int ply_read_header(p_ply ply) {
    assert(ply && (ply->fp || ply->gzfp) && ply->io_mode == PLY_READ);
    if (!ply_read_header_magic(ply)) return 0;
    if (!ply_read_word(ply)) return 0;
    /* parse file format */
    if (!ply_read_header_format(ply)) {
        ply_ferror(ply, "Invalid file format");
        return 0;
    }
    /* parse elements, comments or obj_infos until the end of header */
    while (strcmp(BWORD(ply), "end_header")) {
        if (!ply_read_header_comment(ply) && !ply_read_header_element(ply) &&
            !ply_read_header_obj_info(ply)) {
            ply_ferror(ply, "Unexpected token '%s'", BWORD(ply));
            return 0;
        }
    }
    /* skip extra character? */
    if (ply->rn) {
        if (BSIZE(ply) < 1 && !BREFILL(ply)) {
            ply_ferror(ply, "Unexpected end of file");
            return 0;
        }
        BSKIP(ply, 1);
    }
    return 1;
}